

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Dfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  int fVerbose;
  int fReverse;
  int fNormal;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  bVar3 = false;
  bVar2 = false;
  Extra_UtilGetoptReset();
LAB_002a12bf:
  iVar4 = Extra_UtilGetopt(argc,argv,"nrvh");
  if (iVar4 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Dfs(): There is no AIG.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (bVar1) {
        _fNormal = Gia_ManDupOrderAiger(pAbc->pGia);
        if (bVar2) {
          Abc_Print(-1,"AIG objects are reordered as follows: CIs, ANDs, COs.\n");
        }
      }
      else if (bVar3) {
        _fNormal = Gia_ManDupOrderDfsReverse(pAbc->pGia);
        if (bVar2) {
          Abc_Print(-1,"AIG objects are reordered in the reserve DFS order.\n");
        }
      }
      else {
        _fNormal = Gia_ManDupOrderDfs(pAbc->pGia);
        if (bVar2) {
          Abc_Print(-1,"AIG objects are reordered in the DFS order.\n");
        }
      }
      Abc_FrameUpdateGia(pAbc,_fNormal);
      pAbc_local._4_4_ = 0;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar4) {
  case 0x68:
    break;
  default:
    break;
  case 0x6e:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_002a12bf;
  case 0x72:
    bVar3 = (bool)(bVar3 ^ 1);
    goto LAB_002a12bf;
  case 0x76:
    goto switchD_002a12fd_caseD_76;
  }
  Abc_Print(-2,"usage: &dfs [-nrvh]\n");
  Abc_Print(-2,"\t        orders objects in the DFS order\n");
  pcVar5 = "no";
  if (bVar1) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-n    : toggle using normalized ordering [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar3) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-r    : toggle using reverse DFS ordering [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar2) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_002a12fd_caseD_76:
  bVar2 = (bool)(bVar2 ^ 1);
  goto LAB_002a12bf;
}

Assistant:

int Abc_CommandAbc9Dfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    int fNormal  = 0;
    int fReverse = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fNormal ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dfs(): There is no AIG.\n" );
        return 1;
    }
    if ( fNormal )
    {
        pTemp = Gia_ManDupOrderAiger( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered as follows: CIs, ANDs, COs.\n" );
    }
    else if ( fReverse )
    {
        pTemp = Gia_ManDupOrderDfsReverse( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered in the reserve DFS order.\n" );
    }
    else
    {
        pTemp = Gia_ManDupOrderDfs( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered in the DFS order.\n" );
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dfs [-nrvh]\n" );
    Abc_Print( -2, "\t        orders objects in the DFS order\n" );
    Abc_Print( -2, "\t-n    : toggle using normalized ordering [default = %s]\n", fNormal? "yes": "no" );
    Abc_Print( -2, "\t-r    : toggle using reverse DFS ordering [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}